

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

void __thiscall vmdict_TrieNode::add_word(vmdict_TrieNode *this,char *str,size_t len)

{
  wchar_t c;
  long in_RDX;
  vmdict_TrieNode *in_RDI;
  vmdict_TrieNode *chi;
  wchar_t ch;
  utf8_ptr p;
  vmdict_TrieNode *n;
  char *in_stack_ffffffffffffff98;
  utf8_ptr *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar1;
  vmdict_TrieNode *local_38;
  vmdict_TrieNode *local_20;
  
  utf8_ptr::utf8_ptr(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  local_20 = in_RDI;
  while (in_RDX != 0) {
    c = utf8_ptr::getch((utf8_ptr *)0x32ae0c);
    local_38 = local_20->chi;
    while( true ) {
      uVar1 = false;
      if (local_38 != (vmdict_TrieNode *)0x0) {
        uVar1 = local_38->ch != c;
      }
      if ((bool)uVar1 == false) break;
      local_38 = local_38->nxt;
    }
    if (local_38 == (vmdict_TrieNode *)0x0) {
      local_38 = (vmdict_TrieNode *)operator_new(0x18);
      vmdict_TrieNode(local_38,local_20->chi,c);
      local_20->chi = local_38;
    }
    local_20 = local_38;
    utf8_ptr::inc((utf8_ptr *)in_RDI,(size_t *)CONCAT17(uVar1,in_stack_ffffffffffffffa8));
  }
  local_20->word_cnt = local_20->word_cnt + 1;
  return;
}

Assistant:

void vmdict_TrieNode::add_word(const char *str, size_t len)
{
    vmdict_TrieNode *n;
    utf8_ptr p((char *)str);

    /* scan the string and walk the Trie */
    for (n = this ; len != 0 ; p.inc(&len))
    {
        /* get this character */
        wchar_t ch = p.getch();

        /* find the child node for this letter */
        vmdict_TrieNode *chi;
        for (chi = n->chi ; chi != 0 && chi->ch != ch ; chi = chi->nxt) ;

        /* if there's no existing child for this letter, add one */
        if (chi == 0)
            n->chi = chi = new vmdict_TrieNode(n->chi, ch);

        /* advance to this child node */
        n = chi;
    }

    /* 'n' is the final node for this word, so count the word there */
    n->word_cnt += 1;
}